

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges
               (uint unset_nbr1_index,uint count,ON_SubDVertex *v,ON_SubDEdgePtrLink *links)

{
  ON_SubDVertexTag OVar1;
  char cVar2;
  ushort uVar3;
  ON_SubDEdge *pOVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ON_SubDEdge **ppOVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ON_SubDEdge **ppOVar12;
  long lVar13;
  ON_2udex OVar14;
  ON_SubDEdgePtrLink *pOVar15;
  ON_2udex OVar16;
  bool bVar17;
  uint local_d8 [4];
  ulong local_c8 [2];
  ulong local_b8 [2];
  ON_2udex local_a8 [5];
  ON_2udex pairs [2];
  uint crease_edge_link_index [4];
  uint smooth_edge_link_index [4];
  ON_SubDEdge *vertex_edges [4];
  ON_SubDEdge *link_edges [4];
  
  if (v == (ON_SubDVertex *)0x0 || count < 3) {
    return;
  }
  uVar3 = v->m_edge_count;
  if (uVar3 != count) {
    return;
  }
  OVar1 = v->m_vertex_tag;
  if (count == 4) {
    if (1 < (byte)(OVar1 - Smooth)) {
      return;
    }
  }
  else if (count == 3) {
    if ((OVar1 != Crease) && (OVar1 != Dart)) {
      return;
    }
  }
  else if (OVar1 != Crease) {
    return;
  }
  pairs[1].i = 0;
  pairs[1].j = 0;
  crease_edge_link_index[0] = 0;
  crease_edge_link_index[1] = 0;
  local_a8[4].i = 0;
  local_a8[4].j = 0;
  pairs[0].i = 0;
  pairs[0].j = 0;
  local_a8[2].i = 0;
  local_a8[2].j = 0;
  local_a8[3].i = 0;
  local_a8[3].j = 0;
  local_a8[0].i = 0;
  local_a8[0].j = 0;
  local_a8[1].i = 0;
  local_a8[1].j = 0;
  local_b8[0] = 0;
  local_c8[0] = 0;
  bVar17 = count != 0;
  if (count == 0) {
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar7 = 0;
    uVar11 = 0;
    uVar10 = 0;
    pOVar15 = links;
    do {
      OVar16 = (ON_2udex)((pOVar15->m_ep).m_ptr & 0xfffffffffffffff8);
      if (OVar16 == (ON_2udex)0x0) {
LAB_005f9769:
        bVar5 = false;
      }
      else {
        if (uVar7 < uVar3) {
          OVar14 = (ON_2udex)(v->m_edges[uVar7].m_ptr & 0xfffffffffffffff8);
        }
        else {
          OVar14.i = 0;
          OVar14.j = 0;
        }
        if (OVar14 == (ON_2udex)0x0) goto LAB_005f9769;
        if (uVar7 < 4) {
          pairs[uVar7 - 1] = OVar16;
          local_a8[uVar7] = OVar14;
        }
        cVar2 = *(char *)((long)OVar16 + 0x60);
        if (cVar2 == '\x04') {
LAB_005f9732:
          if (*(short *)((long)OVar16 + 100) != 2) {
            if (cVar2 != '\x02') goto LAB_005f9769;
            goto LAB_005f9753;
          }
          if (uVar10 < 4) {
            *(int *)((long)local_b8 + (ulong)uVar10 * 4) = (int)uVar7;
          }
          uVar10 = uVar10 + 1;
        }
        else {
          if (cVar2 != '\x02') {
            if (cVar2 != '\x01') goto LAB_005f9769;
            goto LAB_005f9732;
          }
LAB_005f9753:
          if (uVar11 < 4) {
            *(int *)((long)local_c8 + (ulong)uVar11 * 4) = (int)uVar7;
          }
          uVar11 = uVar11 + 1;
        }
        bVar5 = true;
      }
      if (!bVar5) break;
      uVar7 = uVar7 + 1;
      bVar17 = uVar7 < count;
      pOVar15 = pOVar15 + 1;
    } while (count != uVar7);
  }
  if (bVar17) {
    return;
  }
  if ((uVar11 == 2) && (v->m_vertex_tag == Crease)) {
    links[local_c8[0] & 0xffffffff].m_nbr_index = links[local_c8[0] >> 0x20].m_index;
    links[local_c8[0] >> 0x20].m_nbr_index = links[local_c8[0] & 0xffffffff].m_index;
    if (uVar10 != 2) {
      if (uVar10 != 1) goto LAB_005f9825;
      links[local_b8[0] & 0xffffffff].m_nbr_index = unset_nbr1_index;
      goto LAB_005f97e5;
    }
  }
  else {
LAB_005f97e5:
    if (uVar10 != 2) goto LAB_005f9825;
  }
  links[local_b8[0] & 0xffffffff].m_nbr_index = links[local_b8[0] >> 0x20].m_index;
  links[local_b8[0] >> 0x20].m_nbr_index = links[local_b8[0] & 0xffffffff].m_index;
  if (uVar11 == 1) {
    links[local_c8[0] & 0xffffffff].m_nbr_index = unset_nbr1_index;
  }
LAB_005f9825:
  if (((((uVar10 == 4 && count == 4) && uVar11 == 0) && (uVar3 == 4)) && (v->m_face_count == 4)) &&
     (v->m_vertex_tag == Smooth)) {
    uVar10 = 0;
    uVar7 = 0;
    do {
      lVar9 = 0;
      do {
        if (local_a8[lVar9] == pairs[uVar7 - 1]) {
          local_a8[lVar9].i = 0;
          local_a8[lVar9].j = 0;
          uVar10 = uVar10 + 1;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    } while ((uVar7 + 1 == (ulong)uVar10) && (bVar17 = uVar7 < 3, uVar7 = uVar7 + 1, bVar17));
    if (uVar10 == 4) {
      lVar9 = 0;
      do {
        lVar13 = *(long *)((long)&pairs[-1].i + lVar9);
        uVar7 = *(ulong *)(lVar13 + 0x68);
        *(ulong *)((long)crease_edge_link_index + lVar9 * 2 + 8) = uVar7 & 0xfffffffffffffff8;
        uVar6 = *(ulong *)(lVar13 + 0x70) & 0xfffffffffffffff8;
        *(ulong *)((long)smooth_edge_link_index + lVar9 * 2) = uVar6;
        if ((uVar7 & 0xfffffffffffffff8) == 0) {
          return;
        }
        if (uVar6 == 0) {
          return;
        }
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      uVar7 = 0;
      lVar9 = -3;
      ppOVar8 = vertex_edges;
      uVar10 = 0;
      do {
        if (uVar7 < 3) {
          pOVar4 = *(ON_SubDEdge **)(crease_edge_link_index + uVar7 * 4 + 2);
          ppOVar12 = ppOVar8;
          lVar13 = lVar9;
          do {
            if (((pOVar4 != ppOVar12[-1]) && (pOVar4 != *ppOVar12)) &&
               (*(ON_SubDEdge **)(smooth_edge_link_index + uVar7 * 4) != *ppOVar12 &&
                *(ON_SubDEdge **)(smooth_edge_link_index + uVar7 * 4) != ppOVar12[-1])) {
              if (uVar10 < 2) {
                local_d8[(ulong)uVar10 * 2] = (uint)uVar7;
                local_d8[(ulong)uVar10 * 2 + 1] = (int)lVar13 + 4;
              }
              uVar10 = uVar10 + 1;
              if (2 < uVar10) break;
            }
            ppOVar12 = ppOVar12 + 2;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0);
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 1;
        ppOVar8 = ppOVar8 + 2;
      } while (uVar7 != 4);
      if (uVar10 == 2) {
        links[local_d8[0]].m_nbr_index = links[local_d8[1]].m_index;
        links[local_d8[1]].m_nbr_index = links[local_d8[0]].m_index;
        links[local_d8[2]].m_nbr_index = links[local_d8[3]].m_index;
        links[local_d8[3]].m_nbr_index = links[local_d8[2]].m_index;
      }
    }
  }
  return;
}

Assistant:

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
  const unsigned int unset_nbr1_index,
  unsigned int count,
  const ON_SubDVertex* v,
  ON_SubDEdgePtrLink* links
)
{
  // If the case can't be resolved by Resolve3OrMoreEdges(), 
  // then the vertex will not appear in the middle of a chain.

  if (count < 3 || nullptr == v || count != (unsigned int)v->m_edge_count)
    return;

  switch (count)
  {
  case 3:
    if (false == v->IsCrease() && false == v->IsDart())
      return;
    break;

  case 4:
    if (false == v->IsCrease() && false == v->IsSmooth())
      return;
    break;

  default:
    if (false == v->IsCrease())
      return;
    break;
  }

  const ON_SubDEdge* link_edges[4] = {};
  const ON_SubDEdge* vertex_edges[4] = {};
  unsigned int crease_edge_count = 0;
  unsigned int smooth_edge_count = 0;
  unsigned int smooth_edge_link_index[4] = {};
  unsigned int crease_edge_link_index[4] = {};
  for (unsigned int j = 0; j < count; j++)
  {
    const ON_SubDEdge* e = links[j].m_ep.Edge();
    if (nullptr == e)
      return;
    const ON_SubDEdge* ve = v->Edge(j);
    if (nullptr == ve)
      return;
    if (j < 4)
    {
      link_edges[j] = e;
      vertex_edges[j] = ve;
    }

    if (e->IsSmooth() && 2 == e->m_face_count)
    {
      if ( smooth_edge_count < 4)
        smooth_edge_link_index[smooth_edge_count] = j;
      ++smooth_edge_count;
    }
    else if (e->IsCrease())
    {
      if (crease_edge_count < 4)
        crease_edge_link_index[crease_edge_count] = j;
      ++crease_edge_count;
    }
    else
      return;
  }

  if ( 2 == crease_edge_count && v->IsCrease() )
  {
    // Link the two creased edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[crease_edge_link_index[0]].m_nbr_index = links[crease_edge_link_index[1]].m_index;
    links[crease_edge_link_index[1]].m_nbr_index = links[crease_edge_link_index[0]].m_index;
    if (1 == smooth_edge_count)
    {
      // this edge will be at the end of a chain.
      links[smooth_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
  }

  if (2 == smooth_edge_count)
  {
    // Link the two smooth edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[smooth_edge_link_index[0]].m_nbr_index = links[smooth_edge_link_index[1]].m_index;
    links[smooth_edge_link_index[1]].m_nbr_index = links[smooth_edge_link_index[0]].m_index;
    if (1 == crease_edge_count)
    {
      // this edge will be at the end of a chain
      links[crease_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
   }

  if (
    4 != count
    || 4 != smooth_edge_count
    || 0 != crease_edge_count
    || 4 != v->m_face_count
    || 4 != v->m_edge_count
    || false == v->IsSmooth()
    )
    return;

  // make sure vertex_edges[] and link_edges[] are the same list.
  unsigned int match_count = 0;
  for (unsigned int j = 0; j == match_count && j < count; j++)
  {
    for (unsigned int k = 0; k < count; k++)
    {
      if (vertex_edges[k] == link_edges[j])
      {
        vertex_edges[k] = nullptr;
        match_count++;
        break;
      }
    }
  }
  if (match_count != count)
    return;
  
  // vertex has 4 faces and 4 smooth edges. Link opposite edges.
  const ON_SubDFace* edge_faces[4][2];
  for (unsigned int j = 0; j < 4; j++)
  {
    edge_faces[j][0] = link_edges[j]->Face(0);
    edge_faces[j][1] = link_edges[j]->Face(1);
    if (nullptr == edge_faces[j][0] || nullptr == edge_faces[j][1])
      return;
  }
  ON_2udex pairs[2];
  unsigned int pair_count = 0;
  ON_2udex pair;
  for (pair.i = 0; pair.i < 4; ++pair.i) for (pair.j = pair.i+1; pair.j < 4; ++pair.j)
  {
    if (
      edge_faces[pair.i][0] != edge_faces[pair.j][0]
      && edge_faces[pair.i][0] != edge_faces[pair.j][1]
      && edge_faces[pair.i][1] != edge_faces[pair.j][0]
      && edge_faces[pair.i][1] != edge_faces[pair.j][1]
      )
    {
      // the associated edges share no faces.
      if ( pair_count < 2)
        pairs[pair_count] = pair;
      if (++pair_count > 2)
        break;
    }
  }
  if (2 == pair_count)
  {
    links[pairs[0].i].m_nbr_index = links[pairs[0].j].m_index;
    links[pairs[0].j].m_nbr_index = links[pairs[0].i].m_index;
    links[pairs[1].i].m_nbr_index = links[pairs[1].j].m_index;
    links[pairs[1].j].m_nbr_index = links[pairs[1].i].m_index;
  }

  return;
}